

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t FSE_readNCount_body_bmi2
                 (short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,void *headerBuffer,
                 size_t hbSize)

{
  uint *puVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  int iVar6;
  uint *puVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar17;
  int iVar18;
  BYTE *istart;
  uint *puVar19;
  bool bVar20;
  char buffer [8];
  undefined8 local_38;
  int iVar16;
  
  if (hbSize < 8) {
    local_38 = 0;
    memcpy(&local_38,headerBuffer,hbSize);
    sVar3 = FSE_readNCount_bmi2(normalizedCounter,maxSVPtr,tableLogPtr,&local_38,8,0);
    sVar4 = 0xffffffffffffffec;
    if (sVar3 <= hbSize) {
      sVar4 = sVar3;
    }
    if (0xffffffffffffff88 < sVar3) {
      sVar4 = sVar3;
    }
  }
  else {
    uVar8 = *maxSVPtr + 1;
    memset(normalizedCounter,0,(ulong)uVar8 * 2);
    uVar5 = *headerBuffer & 0xf;
    sVar4 = 0xffffffffffffffd4;
    if (uVar5 < 0xb) {
      uVar12 = *headerBuffer >> 4;
      *tableLogPtr = uVar5 + 5;
      iVar10 = 0x20 << uVar5;
      iVar15 = iVar10 + 1;
      iVar6 = uVar5 + 6;
      puVar1 = (uint *)((long)headerBuffer + (hbSize - 7));
      puVar19 = (uint *)((long)headerBuffer + (hbSize - 4));
      bVar20 = true;
      uVar5 = 4;
      uVar9 = 0;
      puVar7 = (uint *)headerBuffer;
      do {
        if (!bVar20) {
          uVar14 = 0;
          for (uVar13 = ~uVar12; (uVar13 & 1) == 0; uVar13 = (uVar13 | 0x80000000) >> 1) {
            uVar14 = uVar14 + 1;
          }
          while (0x17 < uVar14) {
            if (puVar1 < puVar7) {
              uVar5 = uVar5 + ((int)puVar7 - (int)puVar1) * 8 & 0x1f;
              puVar7 = puVar19;
            }
            else {
              puVar7 = (uint *)((long)puVar7 + 3);
            }
            uVar12 = *puVar7 >> (uVar5 & 0x1f);
            uVar14 = 0;
            for (uVar13 = ~uVar12; (uVar13 & 1) == 0; uVar13 = (uVar13 | 0x80000000) >> 1) {
              uVar14 = uVar14 + 1;
            }
            uVar9 = uVar9 + 0x24;
          }
          uVar12 = uVar12 >> (uVar14 & 0x1e);
          uVar9 = (uVar12 & 3) + (uVar14 >> 1) * 3 + uVar9;
          uVar5 = uVar5 + (uVar14 & 0xfffffffe) + 2;
          if (uVar9 < uVar8) {
            iVar18 = (int)uVar5 >> 3;
            if ((puVar1 < puVar7) && (puVar19 < (uint *)((long)iVar18 + (long)puVar7))) {
              uVar5 = uVar5 + ((int)puVar7 - (int)puVar19) * 8 & 0x1f;
              puVar7 = puVar19;
            }
            else {
              uVar5 = uVar5 & 7;
              puVar7 = (uint *)((long)puVar7 + (long)iVar18);
            }
            uVar12 = *puVar7 >> uVar5;
          }
          if (uVar8 <= uVar9) break;
        }
        uVar14 = iVar10 * 2 - 1;
        uVar17 = uVar14 - iVar15;
        uVar13 = iVar10 - 1U & uVar12;
        if (uVar13 < uVar17) {
          iVar18 = iVar6 + -1;
        }
        else {
          uVar14 = uVar14 & uVar12;
          if ((int)uVar14 < iVar10) {
            uVar17 = 0;
          }
          uVar13 = uVar14 - uVar17;
          iVar18 = iVar6;
        }
        uVar5 = iVar18 + uVar5;
        iVar18 = uVar13 - 1;
        iVar16 = 1 - uVar13;
        if ((int)uVar13 < 1) {
          iVar16 = iVar18;
        }
        iVar15 = iVar16 + iVar15;
        uVar11 = (ulong)uVar9;
        uVar9 = uVar9 + 1;
        normalizedCounter[uVar11] = (short)iVar18;
        bVar20 = iVar18 != 0;
        if (iVar15 < iVar10) {
          if (1 < iVar15) {
            iVar6 = 0x20 - LZCOUNT(iVar15);
            iVar10 = 1 << ((byte)~(byte)LZCOUNT(iVar15) & 0x1f);
            goto LAB_00155ebe;
          }
LAB_00155ee2:
          bVar2 = false;
        }
        else {
LAB_00155ebe:
          if (uVar8 <= uVar9) goto LAB_00155ee2;
          iVar18 = (int)uVar5 >> 3;
          if ((puVar1 < puVar7) && (puVar19 < (uint *)((long)iVar18 + (long)puVar7))) {
            uVar5 = uVar5 + ((int)puVar7 - (int)puVar19) * 8 & 0x1f;
            puVar7 = puVar19;
          }
          else {
            uVar5 = uVar5 & 7;
            puVar7 = (uint *)((long)puVar7 + (long)iVar18);
          }
          uVar12 = *puVar7 >> uVar5;
          bVar2 = true;
        }
      } while (bVar2);
      sVar4 = 0xffffffffffffffec;
      if (((iVar15 == 1) && (sVar4 = 0xffffffffffffffd0, uVar9 <= uVar8)) &&
         (sVar4 = 0xffffffffffffffec, (int)uVar5 < 0x21)) {
        *maxSVPtr = uVar9 - 1;
        sVar4 = (long)puVar7 + ((long)((int)(uVar5 + 7) >> 3) - (long)headerBuffer);
      }
    }
  }
  return sVar4;
}

Assistant:

BMI2_TARGET_ATTRIBUTE static size_t FSE_readNCount_body_bmi2(
        short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
        const void* headerBuffer, size_t hbSize)
{
    return FSE_readNCount_body(normalizedCounter, maxSVPtr, tableLogPtr, headerBuffer, hbSize);
}